

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

ObjectPtr<tvm::runtime::GraphRuntime> __thiscall
tvm::runtime::ObjAllocatorBase<tvm::runtime::SimpleObjAllocator>::
make_object<tvm::runtime::GraphRuntime>(ObjAllocatorBase<tvm::runtime::SimpleObjAllocator> *this)

{
  uint32_t uVar1;
  GraphRuntime *pGVar2;
  FDeleter p_Var3;
  SimpleObjAllocator *in_RSI;
  Object *local_28;
  GraphRuntime *ptr;
  ObjAllocatorBase<tvm::runtime::SimpleObjAllocator> *this_local;
  
  pGVar2 = SimpleObjAllocator::Handler<tvm::runtime::GraphRuntime>::New<>(in_RSI);
  uVar1 = ModuleNode::RuntimeTypeIndex();
  (pGVar2->super_ModuleNode).super_Object.type_index_ = uVar1;
  p_Var3 = SimpleObjAllocator::Handler<tvm::runtime::GraphRuntime>::Deleter();
  (pGVar2->super_ModuleNode).super_Object.deleter_ = p_Var3;
  local_28 = (Object *)0x0;
  if (pGVar2 != (GraphRuntime *)0x0) {
    local_28 = &(pGVar2->super_ModuleNode).super_Object;
  }
  ObjectPtr<tvm::runtime::GraphRuntime>::ObjectPtr
            ((ObjectPtr<tvm::runtime::GraphRuntime> *)this,local_28);
  return (ObjectPtr<tvm::runtime::GraphRuntime>)(Object *)this;
}

Assistant:

inline ObjectPtr<T> make_object(Args&&... args) {
    using Handler = typename Derived::template Handler<T>;
    static_assert(std::is_base_of<Object, T>::value,
                  "make can only be used to create Object");
    T* ptr = Handler::New(static_cast<Derived*>(this),
                         std::forward<Args>(args)...);
    ptr->type_index_ = T::RuntimeTypeIndex();
    ptr->deleter_ = Handler::Deleter();
    return ObjectPtr<T>(ptr);
  }